

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O1

RotationalInertia * __thiscall
iDynTree::SpatialInertia::getRotationalInertiaWrtCenterOfMass
          (RotationalInertia *__return_storage_ptr__,SpatialInertia *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  ActualDstType actualDst;
  undefined1 auVar6 [16];
  Vector3d local_88;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  double local_28;
  
  RotationalInertia::RotationalInertia(__return_storage_ptr__);
  if (this->m_mass == 0.0) {
    dVar1 = (this->m_rotInertia).super_Matrix3x3.m_data[1];
    (__return_storage_ptr__->super_Matrix3x3).m_data[0] =
         (this->m_rotInertia).super_Matrix3x3.m_data[0];
    (__return_storage_ptr__->super_Matrix3x3).m_data[1] = dVar1;
    dVar1 = (this->m_rotInertia).super_Matrix3x3.m_data[3];
    (__return_storage_ptr__->super_Matrix3x3).m_data[2] =
         (this->m_rotInertia).super_Matrix3x3.m_data[2];
    (__return_storage_ptr__->super_Matrix3x3).m_data[3] = dVar1;
    dVar1 = (this->m_rotInertia).super_Matrix3x3.m_data[5];
    (__return_storage_ptr__->super_Matrix3x3).m_data[4] =
         (this->m_rotInertia).super_Matrix3x3.m_data[4];
    (__return_storage_ptr__->super_Matrix3x3).m_data[5] = dVar1;
    dVar1 = (this->m_rotInertia).super_Matrix3x3.m_data[7];
    (__return_storage_ptr__->super_Matrix3x3).m_data[6] =
         (this->m_rotInertia).super_Matrix3x3.m_data[6];
    (__return_storage_ptr__->super_Matrix3x3).m_data[7] = dVar1;
    (__return_storage_ptr__->super_Matrix3x3).m_data[8] =
         (this->m_rotInertia).super_Matrix3x3.m_data[8];
  }
  else {
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = this->m_mcom[0];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = this->m_mcom[1];
    local_88.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
         = this->m_mcom[2];
    squareCrossProductMatrix(&local_88);
    dVar1 = this->m_mass;
    dVar5 = (this->m_rotInertia).super_Matrix3x3.m_data[1];
    auVar6._8_8_ = dVar1;
    auVar6._0_8_ = dVar1;
    auVar6 = divpd(local_68,auVar6);
    (__return_storage_ptr__->super_Matrix3x3).m_data[0] =
         auVar6._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[0];
    (__return_storage_ptr__->super_Matrix3x3).m_data[1] = auVar6._8_8_ + dVar5;
    dVar5 = (this->m_rotInertia).super_Matrix3x3.m_data[3];
    auVar2._8_8_ = dVar1;
    auVar2._0_8_ = dVar1;
    auVar6 = divpd(local_58,auVar2);
    (__return_storage_ptr__->super_Matrix3x3).m_data[2] =
         auVar6._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[2];
    (__return_storage_ptr__->super_Matrix3x3).m_data[3] = auVar6._8_8_ + dVar5;
    dVar5 = (this->m_rotInertia).super_Matrix3x3.m_data[5];
    auVar3._8_8_ = dVar1;
    auVar3._0_8_ = dVar1;
    auVar6 = divpd(local_48,auVar3);
    (__return_storage_ptr__->super_Matrix3x3).m_data[4] =
         auVar6._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[4];
    (__return_storage_ptr__->super_Matrix3x3).m_data[5] = auVar6._8_8_ + dVar5;
    dVar5 = (this->m_rotInertia).super_Matrix3x3.m_data[7];
    auVar4._8_8_ = dVar1;
    auVar4._0_8_ = dVar1;
    auVar6 = divpd(local_38,auVar4);
    (__return_storage_ptr__->super_Matrix3x3).m_data[6] =
         auVar6._0_8_ + (this->m_rotInertia).super_Matrix3x3.m_data[6];
    (__return_storage_ptr__->super_Matrix3x3).m_data[7] = auVar6._8_8_ + dVar5;
    (__return_storage_ptr__->super_Matrix3x3).m_data[8] =
         local_28 / dVar1 + (this->m_rotInertia).super_Matrix3x3.m_data[8];
  }
  return __return_storage_ptr__;
}

Assistant:

RotationalInertia SpatialInertia::getRotationalInertiaWrtCenterOfMass() const
{
    RotationalInertia retComInertia;
    // Here we need to compute the rotational inertia at the com
    // given the one expressed at the frame origin
    // we apply formula 2.63 in Featherstone 2008
    Eigen::Map<const Eigen::Matrix3d> linkInertia(this->m_rotInertia.data());
    Eigen::Map<Eigen::Matrix3d> comInertia(retComInertia.data());
    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);

    if( fabs(this->m_mass) > 0 )
    {
        comInertia = linkInertia + squareCrossProductMatrix(mcom)/this->m_mass;
    }
    else
    {
        comInertia = linkInertia;
    }

    return retComInertia;
}